

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::eval_selection_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  long lVar2;
  Vector<unsigned_int,_4> *pVVar3;
  float local_68 [4];
  float local_58 [4];
  Vector<unsigned_int,_4> res_1;
  Vector<unsigned_int,_4> res;
  Vector<float,_4> res_2;
  undefined8 local_18;
  undefined8 uStack_10;
  
  fVar1 = c->in[0].m_data[2];
  local_58[0] = c->in[1].m_data[3];
  local_58[1] = c->in[1].m_data[2];
  local_58[2] = c->in[1].m_data[1];
  local_58[3] = c->in[1].m_data[0];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = (uint)(long)local_58[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_68[0] = c->in[2].m_data[0];
  local_68[1] = c->in[2].m_data[3];
  local_68[2] = c->in[2].m_data[2];
  local_68[3] = c->in[2].m_data[1];
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = (uint)(long)local_68[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar3 = &res_1;
  if (0.0 < fVar1) {
    pVVar3 = &res;
  }
  local_18 = *(undefined8 *)pVVar3->m_data;
  uStack_10 = *(undefined8 *)(pVVar3->m_data + 2);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = (float)*(uint *)((long)&local_18 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)(c->color).m_data = res_2.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = res_2.m_data._8_8_;
  return;
}

Assistant:

void eval_selection_uvec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(3, 2, 1, 0).asUint(),	c.in[2].swizzle(0, 3, 2, 1).asUint()).asFloat(); }